

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

int qpdf_oh_get_generation(qpdf_data qpdf,qpdf_oh oh)

{
  int iVar1;
  undefined4 local_4c;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._M_unused._M_object = &local_4c;
  local_4c = 0;
  local_28._8_8_ = 0;
  pcStack_10 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1681:56)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1681:56)>
             ::_M_manager;
  iVar1 = do_with_oh<int>(qpdf,oh,(function<int_()> *)&local_28,
                          (function<int_(QPDFObjectHandle_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return iVar1;
}

Assistant:

int
qpdf_oh_get_generation(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<int>(qpdf, oh, return_T<int>(0), [](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_generation");
        return o.getGeneration();
    });
}